

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O2

Mtbdd __thiscall sylvan::Mtbdd::MtbddStrictThreshold(Mtbdd *this,double value)

{
  MTBDD MVar1;
  MTBDD *in_RSI;
  
  MVar1 = mtbdd_strict_threshold_double_RUN(*in_RSI,value);
  this->mtbdd = MVar1;
  mtbdd_protect(&this->mtbdd);
  return (Mtbdd)(MTBDD)this;
}

Assistant:

Mtbdd
Mtbdd::MtbddStrictThreshold(double value) const
{
    return mtbdd_strict_threshold_double(mtbdd, value);
}